

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subtypes.h
# Opt level: O2

vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> * __thiscall
wasm::SubTypes::getStrictSubTypes(SubTypes *this,HeapType type)

{
  int iVar1;
  const_iterator cVar2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar3;
  key_type local_18;
  HeapType type_local;
  
  local_18.id = type.id;
  if (0xd < type.id) {
    cVar2 = std::
            _Hashtable<wasm::HeapType,_std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_std::allocator<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>_>,_std::__detail::_Select1st,_std::equal_to<wasm::HeapType>,_std::hash<wasm::HeapType>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(&(this->typeSubTypes)._M_h,&local_18);
    if (cVar2.
        super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      pvVar3 = &getStrictSubTypes::empty;
      if (getStrictSubTypes(wasm::HeapType)::empty == '\0') {
        iVar1 = __cxa_guard_acquire(&getStrictSubTypes(wasm::HeapType)::empty);
        if (iVar1 != 0) {
          pvVar3 = &getStrictSubTypes::empty;
          getStrictSubTypes::empty.
          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)0x0;
          getStrictSubTypes::empty.
          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_finish = (pointer)0x0;
          getStrictSubTypes::empty.
          super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          __cxa_atexit(std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector,
                       &getStrictSubTypes::empty,&__dso_handle);
          __cxa_guard_release(&getStrictSubTypes(wasm::HeapType)::empty);
        }
      }
    }
    else {
      pvVar3 = (vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
               ((long)cVar2.
                      super__Node_iterator_base<std::pair<const_wasm::HeapType,_std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>_>,_true>
                      ._M_cur + 0x10);
    }
    return pvVar3;
  }
  __assert_fail("!type.isBasic()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/ir/subtypes.h"
                ,0x28,
                "const std::vector<HeapType> &wasm::SubTypes::getStrictSubTypes(HeapType) const");
}

Assistant:

const std::vector<HeapType>& getStrictSubTypes(HeapType type) const {
    assert(!type.isBasic());
    if (auto iter = typeSubTypes.find(type); iter != typeSubTypes.end()) {
      return iter->second;
    }

    // No entry exists. Return a canonical constant empty vec, to avoid
    // allocation.
    static const std::vector<HeapType> empty;
    return empty;
  }